

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_model-base-ekf-flex-estimator-imu_withComBias_withForcesSensors.cpp
# Opt level: O0

int test(void)

{
  double dVar1;
  uint uVar2;
  ostream *poVar3;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *pDVar4;
  Scalar *pSVar5;
  DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pDVar6;
  long *plVar7;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  Matrix *pMVar8;
  Matrix local_2670;
  Matrix local_2658;
  Matrix local_2640;
  Matrix local_2628;
  Matrix<double,__1,_1,_0,__1,_1> local_2610;
  Matrix<double,__1,_1,_0,__1,_1> local_2600;
  Matrix local_25f0;
  undefined1 local_25d8 [8];
  Matrix4 identity;
  Matrix local_2540;
  Type local_2528;
  Vector6 local_24f8;
  Matrix4 local_24c8;
  non_const_type local_2440;
  Type local_2438;
  Type local_2408;
  TransposeReturnType local_23d8;
  uint local_23a4;
  undefined1 local_23a0 [4];
  uint i;
  Type local_2368;
  Type local_2330;
  TransposeReturnType local_22f8;
  Matrix<double,__1,_1,_0,__1,_1> local_22c0;
  Matrix<double,__1,_1,_0,__1,_1> local_22b0;
  Type local_22a0;
  TransposeReturnType local_2268;
  Type local_2230;
  TransposeReturnType local_21f8;
  uint local_21bc;
  undefined1 local_21b8 [4];
  uint k;
  Matrix4 inputFeetPositionsk;
  Vector6 measurementForcesk;
  Vector6 filteredForcesk;
  undefined1 local_20d0 [8];
  Vector filteredZmp;
  Vector sensorZmp;
  IndexedMatrixArray inputFeetPositions;
  IndexedMatrixArray local_2058 [8];
  IndexedMatrixArray filteredForces;
  IndexedMatrixArray local_2000 [8];
  IndexedMatrixArray measurementForces;
  uint measurementSize;
  uint inputSize;
  uint contactNbr;
  Vector xPredicted;
  Vector x;
  Vector measurement;
  Vector input;
  Scalar local_1f20;
  Type local_1f18;
  Scalar local_1ee0;
  Type local_1ed8;
  Scalar local_1ea0;
  Type local_1e98;
  Scalar local_1e60;
  Type local_1e58;
  Scalar local_1e20;
  undefined1 local_1e18 [8];
  Matrix Q_;
  Scalar local_1dc8;
  Type local_1dc0;
  Scalar local_1d88;
  undefined1 local_1d80 [8];
  Matrix R_;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_1d60;
  Matrix<double,3,3,0,3,3> local_1d40 [73];
  StorageBaseType local_1cf7 [3];
  int local_1cf4;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_1cf0;
  Matrix<double,3,3,0,3,3> local_1cd0 [73];
  StorageBaseType local_1c87 [3];
  int local_1c84;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_1c80;
  Matrix<double,3,3,0,3,3> local_1c60 [73];
  StorageBaseType local_1c17 [3];
  int local_1c14;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_1c10;
  Matrix<double,3,3,0,3,3> local_1bf0 [72];
  ModelBaseEKFFlexEstimatorIMU local_1ba8 [8];
  ModelBaseEKFFlexEstimatorIMU est;
  IndexedMatrixArray local_460 [8];
  IndexedMatrixArray referenceZmp_output;
  IndexedMatrixArray local_408 [8];
  IndexedMatrixArray filteredZmp_output;
  IndexedMatrixArray local_3b0 [8];
  IndexedMatrixArray sensorZmp_output;
  IndexedMatrixArray local_358 [8];
  IndexedMatrixArray u_output;
  IndexedMatrixArray local_300 [8];
  IndexedMatrixArray y_output;
  IndexedMatrixArray local_2a8 [8];
  IndexedMatrixArray xPredicted_output;
  IndexedMatrixArray local_250 [8];
  IndexedMatrixArray x_output;
  IndexedMatrixArray local_1f8 [8];
  IndexedMatrixArray zmpRef;
  IndexedMatrixArray local_1a0 [8];
  IndexedMatrixArray bias;
  IndexedMatrixArray local_148 [8];
  IndexedMatrixArray nbSupport;
  IndexedMatrixArray local_f0 [8];
  IndexedMatrixArray u;
  IndexedMatrixArray local_88 [8];
  IndexedMatrixArray y;
  uint stateSize;
  uint inputSizeBase;
  uint measurementSizeBase;
  uint kmax;
  uint kinit;
  double dt;
  bool withComBias_;
  bool withAbsolutePose_;
  bool withForceSensors_;
  bool withUnmodeledForces_;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Starting");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_88);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading measurements file");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  stateObservation::IndexedMatrixArray::getFromFile((char *)local_88,0x19806b,1);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_f0);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading input file");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  stateObservation::IndexedMatrixArray::getFromFile((char *)local_f0,0x198095,1);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_148);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading the number of supports file");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  stateObservation::IndexedMatrixArray::getFromFile((char *)local_148,0x1980ca,1);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_1a0);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading comBias file");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  stateObservation::IndexedMatrixArray::getFromFile((char *)local_1a0,0x1980f4,1);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_1f8);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading zmpRef file");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  stateObservation::IndexedMatrixArray::getFromFile((char *)local_1f8,0x19811b,1);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_250);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_2a8);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_300);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_358);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_3b0);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_408);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_460);
  poVar3 = std::operator<<((ostream *)&std::cout,"Creating estimator");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ModelBaseEKFFlexEstimatorIMU(local_1ba8,0.005);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setSamplingPeriod(0.005);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactModel
            ((uint)local_1ba8);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setRobotMass(56.8);
  local_1c14 = 40000;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*(&local_1c10,&local_1c14,local_1c17);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            (local_1bf0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_1c10);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfe
            ((Matrix *)local_1ba8);
  local_1c84 = 0x15e;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*(&local_1c80,&local_1c84,local_1c87);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            (local_1c60,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_1c80);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKte
            ((Matrix *)local_1ba8);
  local_1cf4 = 600;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*(&local_1cf0,&local_1cf4,local_1cf7);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            (local_1cd0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_1cf0);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfv
            ((Matrix *)local_1ba8);
  R_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ = 10;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*(&local_1d60,
                   (int *)((long)&R_.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols + 4),
                   (StorageBaseType *)
                   ((long)&R_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols + 1));
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            (local_1d40,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_1d60);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKtv
            ((Matrix *)local_1ba8);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces
            (SUB81(local_1ba8,0));
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithForcesMeasurements
            (SUB81(local_1ba8,0));
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithAbsolutePos
            (SUB81(local_1ba8,0));
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithComBias
            (SUB81(local_1ba8,0));
  poVar3 = std::operator<<((ostream *)&std::cout,"Setting covariances");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_1d80);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1d80,6,6);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1d80);
  local_1d88 = 0.001;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            (&local_1dc0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1d80,0,0,3,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &local_1dc0,&local_1d88);
  local_1dc8 = 1e-06;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            ((Type *)&Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1d80,3,3,3,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             &local_1dc8);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  setMeasurementNoiseCovariance((Matrix *)local_1ba8);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance
            (1e-13);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setForceVariance(1e-06);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setAbsolutePosVariance
            (0.0001);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_1e18);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1e18,0x23,0x23);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1e18);
  local_1e20 = 1e-08;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            (&local_1e58,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1e18,0,0,0xc,0xc);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &local_1e58,&local_1e20);
  local_1e60 = 0.0001;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            (&local_1e98,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1e18,0xc,0xc,0xc,
             0xc);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &local_1e98,&local_1e60);
  local_1ea0 = 0.01;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            (&local_1ed8,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1e18,0x18,0x18,6,6)
  ;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &local_1ed8,&local_1ea0);
  local_1ee0 = 1e-07;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            (&local_1f18,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1e18,0x1e,0x1e,2,2)
  ;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &local_1f18,&local_1ee0);
  local_1f20 = 1e-08;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            ((Type *)&input.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                      .m_rows,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1e18,0x20,0x20
             ,3,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &input.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             &local_1f20);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setProcessNoiseCovariance
            ((Matrix *)local_1ba8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,0x23);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&inputSize);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&inputSize,0x23);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_2000);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_2058);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray
            ((IndexedMatrixArray *)
             &sensorZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &filteredZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_20d0);
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (measurementForcesk.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
              m_storage.m_data.array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (inputFeetPositionsk.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
              m_storage.m_data.array + 0xf));
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_21b8);
  poVar3 = std::operator<<((ostream *)&std::cout,"Beginning reconstruction ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_21bc = 10000; local_21bc < 0x2cec; local_21bc = local_21bc + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\n");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_21bc);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
             stateObservation::IndexedMatrixArray::operator[](local_148,local_21bc);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (pDVar4,0);
    dVar1 = *pSVar5;
    uVar2 = stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getContactsNumber
                      (local_1ba8);
    if ((dVar1 != (double)uVar2) || (NAN(dVar1) || NAN((double)uVar2))) {
      pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
               stateObservation::IndexedMatrixArray::operator[](local_148,local_21bc);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (pDVar4,0);
      measurementSize = (uint)(long)*pSVar5;
      stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactsNumber
                ((uint)local_1ba8);
    }
    uVar2 = stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
            getMeasurementSize();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (ulong)uVar2);
    pDVar6 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
             stateObservation::IndexedMatrixArray::operator[](local_88,local_21bc);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
              (&local_2230,pDVar6,0,0,1,uVar2);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    transpose(&local_21f8,
              (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              &local_2230);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                *)&local_21f8);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)local_1ba8);
    uVar2 = stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getInputSize();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_rows,(ulong)uVar2);
    pDVar6 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
             stateObservation::IndexedMatrixArray::operator[](local_f0,local_21bc + 1);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
              (&local_22a0,pDVar6,0,0,1,uVar2);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    transpose(&local_2268,
              (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              &local_22a0);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)
               &measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_rows,(DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                         *)&local_2268);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)local_1ba8);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
    plVar7 = (long *)stateObservation::ExtendedKalmanFilter::getFunctor();
    pDVar6 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
             stateObservation::IndexedMatrixArray::operator[](local_f0,local_21bc - 1);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
              (&local_2330,pDVar6,0,0,1,uVar2);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    transpose(&local_22f8,
              (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              &local_2330);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_22c0,
               (EigenBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                *)&local_22f8);
    (**(code **)(*plVar7 + 0x10))
              (&local_22b0,plVar7,
               &xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,&local_22c0,0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)&inputSize,&local_22b0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_22b0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_22c0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_2368,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,0xc,0xc);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)local_23a0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&inputSize,
               0xc,0xc);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::operator=
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_23a0,&local_2368);
    other = (Matrix<double,__1,_1,_0,__1,_1> *)
            stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
            getFlexibilityVector();
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,other);
    for (local_23a4 = 0; local_23a4 < measurementSize; local_23a4 = local_23a4 + 1) {
      pDVar6 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
               stateObservation::IndexedMatrixArray::operator[](local_88,local_21bc);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,6>
                (&local_2408,pDVar6,0,(ulong)(local_23a4 * 6 + 6));
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_6,_false>_>::
      transpose(&local_23d8,
                (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>_> *)
                &local_2408);
      Eigen::Matrix<double,6,1,0,6,1>::operator=
                ((Matrix<double,6,1,0,6,1> *)
                 (inputFeetPositionsk.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                  m_storage.m_data.array + 0xf),
                 (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>_>_>
                  *)&local_23d8);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<6>
                (&local_2438,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 &xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows,(ulong)(local_23a4 * 6 + 0xc),6);
      Eigen::Matrix<double,6,1,0,6,1>::operator=
                ((Matrix<double,6,1,0,6,1> *)
                 (measurementForcesk.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                  m_storage.m_data.array + 5),
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_6,_1,_false>_> *)
                 &local_2438);
      pDVar6 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
               stateObservation::IndexedMatrixArray::operator[](local_f0,local_21bc);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<1,6>
                (&local_2528,pDVar6,0,(ulong)(local_23a4 * 0xc + 0x2a));
      Eigen::Matrix<double,6,1,0,6,1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,6,false>>
                ((Matrix<double,6,1,0,6,1> *)&local_24f8,
                 (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>_> *)
                 &local_2528);
      stateObservation::kine::vector6ToHomogeneousMatrix(&local_24c8,&local_24f8);
      local_2440 = (non_const_type)
                   Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::transpose
                             ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_24c8);
      Eigen::Matrix<double,4,4,0,4,4>::operator=
                ((Matrix<double,4,4,0,4,4> *)local_21b8,
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)&local_2440)
      ;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,6,1,0,6,1>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_2540,
                 (EigenBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                 (inputFeetPositionsk.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                  m_storage.m_data.array + 0xf));
      stateObservation::IndexedMatrixArray::setValue(local_2000,&local_2540,local_23a4);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2540);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,6,1,0,6,1>>
                ((Matrix<double,_1,_1,0,_1,_1> *)
                 (identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + 0xf),
                 (EigenBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                 (measurementForcesk.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                  m_storage.m_data.array + 5));
      stateObservation::IndexedMatrixArray::setValue
                (local_2058,
                 (Matrix *)
                 (identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + 0xf),local_23a4);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)
                 (identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + 0xf));
      Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_25d8);
      Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
                ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_25d8);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,4,4,0,4,4>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_25f0,
                 (EigenBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_25d8);
      stateObservation::IndexedMatrixArray::setValue
                ((IndexedMatrixArray *)
                 &sensorZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_rows,&local_25f0,local_23a4);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_25f0);
    }
    computeZmp((uint)&local_2600,(IndexedMatrixArray *)(ulong)measurementSize,local_2000);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &filteredZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_rows,&local_2600);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_2600);
    computeZmp((uint)&local_2610,(IndexedMatrixArray *)(ulong)measurementSize,local_2058);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_20d0,&local_2610);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_2610);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_2628,
               (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    stateObservation::IndexedMatrixArray::setValue(local_250,&local_2628,local_21bc);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2628);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_2640,
               (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&inputSize);
    stateObservation::IndexedMatrixArray::setValue(local_2a8,&local_2640,local_21bc);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2640);
    pMVar8 = stateObservation::IndexedMatrixArray::operator[](local_88,local_21bc);
    stateObservation::IndexedMatrixArray::setValue(local_300,pMVar8,local_21bc);
    pMVar8 = stateObservation::IndexedMatrixArray::operator[](local_f0,local_21bc);
    stateObservation::IndexedMatrixArray::setValue(local_358,pMVar8,local_21bc);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_2658,
               (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &filteredZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_rows);
    stateObservation::IndexedMatrixArray::setValue(local_3b0,&local_2658,local_21bc);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2658);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_2670,
               (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_20d0);
    stateObservation::IndexedMatrixArray::setValue(local_408,&local_2670,local_21bc);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2670);
    pMVar8 = stateObservation::IndexedMatrixArray::operator[](local_1f8,local_21bc);
    stateObservation::IndexedMatrixArray::setValue(local_460,pMVar8,local_21bc);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Completed ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  stateObservation::IndexedMatrixArray::writeInFile((char *)local_250);
  stateObservation::IndexedMatrixArray::writeInFile((char *)local_2a8);
  stateObservation::IndexedMatrixArray::writeInFile((char *)local_300);
  stateObservation::IndexedMatrixArray::writeInFile((char *)local_358);
  stateObservation::IndexedMatrixArray::writeInFile((char *)local_3b0);
  stateObservation::IndexedMatrixArray::writeInFile((char *)local_408);
  stateObservation::IndexedMatrixArray::writeInFile((char *)local_460);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_20d0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &filteredZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray
            ((IndexedMatrixArray *)
             &sensorZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_2058);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_2000);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&inputSize);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_1e18)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_1d80)
  ;
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ~ModelBaseEKFFlexEstimatorIMU(local_1ba8);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_460);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_408);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_3b0);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_358);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_300);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_2a8);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_250);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_1f8);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_1a0);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_148);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_f0);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_88);
  return 1;
}

Assistant:

int test()
{
    std::cout << "Starting" << std::endl;

    // For measurement vector
    bool withUnmodeledForces_ = false;
    bool withForceSensors_=true;
    bool withAbsolutePose_ = false;

    // For state vector
    bool withComBias_=false;

    // Time
    const double dt=5e-3;
    const unsigned kinit=10000; //3500; //3758; //
    const unsigned kmax=11500; //5700; //5100; //

    // Fix sizes
    const unsigned measurementSizeBase=6;
    const unsigned inputSizeBase=42;
    const unsigned stateSize=35;

    /// Definitions of input vectors
     // Measurement
     IndexedMatrixArray y;
     std::cout << "Loading measurements file" << std::endl;
     y.getFromFile("source_measurement.dat",1,30);

     // Input
     IndexedMatrixArray u;
     std::cout << "Loading input file" << std::endl;
     u.getFromFile("source_input.dat",1,66);

     // Number of support contacts
     IndexedMatrixArray nbSupport;
     std::cout << "Loading the number of supports file" << std::endl;
     nbSupport.getFromFile("source_nbSupport.dat",1,1);

     // CoM bias
     IndexedMatrixArray bias;
     std::cout << "Loading comBias file" << std::endl;
     bias.getFromFile("source_comBias.dat",1,35);

     // Zmp ref
     IndexedMatrixArray zmpRef;
     std::cout << "Loading zmpRef file" << std::endl;
     zmpRef.getFromFile("source_zmpRef.dat",1,3);

    /// Definition of ouptut vectors 
     // State: what we want
     IndexedMatrixArray x_output;
     // State: what we want
     IndexedMatrixArray xPredicted_output;
     // Measurement
     IndexedMatrixArray y_output;
     // Input
     IndexedMatrixArray u_output;

     // Zmp from sensors
     IndexedMatrixArray sensorZmp_output;
     // Zmp from filter
     IndexedMatrixArray filteredZmp_output;
     // reference Zmp
     IndexedMatrixArray referenceZmp_output;

    std::cout << "Creating estimator" <<std::endl;

    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU est;
    est.setSamplingPeriod(dt);

    // Model
    est.setContactModel(1);
    est.setRobotMass(56.8);
    est.setKfe(40000*Matrix3::Identity());
    est.setKte(350*Matrix3::Identity());
    est.setKfv(600*Matrix3::Identity());
    est.setKtv(10*Matrix3::Identity());

    // Config
    est.setWithUnmodeledForces(withUnmodeledForces_);
    est.setWithForcesMeasurements(withForceSensors_);
    est.setWithAbsolutePos(withAbsolutePose_);
    est.setWithComBias(withComBias_);

    std::cout << "Setting covariances" << std::endl;

    // Measurement noise covariance
    stateObservation::Matrix R_; R_.resize(measurementSizeBase,measurementSizeBase); R_.setIdentity();
    R_.block(0,0,3,3)*=1.e-3;
    R_.block(3,3,3,3)*=1.e-6;
    est.setMeasurementNoiseCovariance(R_);
    est.setUnmodeledForceVariance(1e-13);
    est.setForceVariance(1.e-6);
    est.setAbsolutePosVariance(1e-4);

    // Process noise covariance
    stateObservation::Matrix Q_; Q_.resize(stateSize,stateSize); Q_.setIdentity();
    Q_.block(0,0,12,12)*=1.e-8;
    Q_.block(12,12,12,12)*=1.e-4;
    Q_.block(24,24,6,6)*=1.e-2;
    Q_.block(30,30,2,2)*=1.e-7;
    Q_.block(32,32,3,3)*=1.e-8;
    est.setProcessNoiseCovariance(Q_);

    // Temporary variables
    stateObservation::Vector input, measurement;
    Vector x; x.resize(stateSize);
    Vector xPredicted; xPredicted.resize(stateSize);
    unsigned contactNbr, inputSize, measurementSize;

    stateObservation::IndexedMatrixArray measurementForces, filteredForces, inputFeetPositions;
    stateObservation::Vector sensorZmp, filteredZmp;
    stateObservation::Vector6 filteredForcesk, measurementForcesk;
    stateObservation::Matrix4 inputFeetPositionsk;

    std::cout << "Beginning reconstruction "<<std::endl;

    for (unsigned k=kinit;k<kmax;++k)
    {
        std::cout << "\n" << k << std::endl;   

        if(nbSupport[k](0)!=est.getContactsNumber())
        {
            contactNbr = nbSupport[k](0);
            est.setContactsNumber(contactNbr);
        }

        measurementSize = est.getMeasurementSize();
        measurement.resize(measurementSize);
        measurement = (y[k].block(0,0,1,measurementSize)).transpose();
        est.setMeasurement(measurement);

        inputSize = est.getInputSize();
        input.resize(inputSize);
        input = (u[k+1].block(0,0,1,inputSize)).transpose();
        est.setMeasurementInput(input);

        xPredicted = est.getEKF().getFunctor()->stateDynamics(x,(u[k-1].block(0,0,1,inputSize)).transpose(),0);
        xPredicted.segment(stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::state::fc,12)
               = x.segment(stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::state::fc,12);

        x = est.getFlexibilityVector();

        // Compute Zmp from sensor and filter
        for(unsigned i=0;i<contactNbr;++i)
        {
            measurementForcesk = y[k].block<1,6>(0,measurementSizeBase+withUnmodeledForces_*6+i*6).transpose();
            filteredForcesk = x.segment<6>(stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::state::fc+i*6);
            inputFeetPositionsk = kine::vector6ToHomogeneousMatrix(u[k].block<1,6>(0,inputSizeBase+i*12)).transpose();

//            measurementForcesk.segment<3>(0) = inputFeetPositionsk.block(0,0,3,3).transpose()*measurementForcesk.segment<3>(0);
//            measurementForcesk.segment<3>(3) = inputFeetPositionsk.block(0,0,3,3).transpose()*measurementForcesk.segment<3>(3)
//                                               +kine::skewSymmetric(inputFeetPositionsk.block(0,0,3,3).transpose()*inputFeetPositionsk.block(0,3,3,1))*measurementForcesk.segment<3>(0);
//
//            filteredForcesk.segment<3>(0) = inputFeetPositionsk.block(0,0,3,3).transpose()*filteredForcesk.segment<3>(0);
//            filteredForcesk.segment<3>(3) = inputFeetPositionsk.block(0,0,3,3).transpose()*filteredForcesk.segment<3>(3)
//                                               -kine::skewSymmetric(inputFeetPositionsk.block(0,0,3,3).transpose()*inputFeetPositionsk.block(0,3,3,1))*filteredForcesk.segment<3>(0);

            measurementForces.setValue(measurementForcesk,i);
            filteredForces.setValue(filteredForcesk,i);
            stateObservation::Matrix4 identity; identity.setIdentity();
            inputFeetPositions.setValue(identity,i);
        }
        sensorZmp=computeZmp(contactNbr, measurementForces, inputFeetPositions);
        filteredZmp=computeZmp(contactNbr, filteredForces, inputFeetPositions);

        x_output.setValue(x,k);
        xPredicted_output.setValue(xPredicted,k);
        y_output.setValue(y[k],k);
        u_output.setValue(u[k],k);
        sensorZmp_output.setValue(sensorZmp,k);
        filteredZmp_output.setValue(filteredZmp,k);
        referenceZmp_output.setValue(zmpRef[k],k);
    }

    std::cout << "Completed "<<std::endl;

    x_output.writeInFile("state.dat");
    xPredicted_output.writeInFile("statePredicted.dat");
    y_output.writeInFile("measurement.dat");
    u_output.writeInFile("input.dat");
    sensorZmp_output.writeInFile("sensorZmp.dat");
    filteredZmp_output.writeInFile("filteredZmp.dat");
    referenceZmp_output.writeInFile("referenceZmp.dat");

    return 1;
}